

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count.hpp
# Opt level: O2

size_type trial::dynamic::value::count<std::allocator<char>,double>
                    (basic_variable<std::allocator<char>_> *self,double *other)

{
  bool bVar1;
  value vVar2;
  const_reference self_00;
  size_type sVar3;
  const_iterator it;
  const_iterator local_60;
  iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_48;
  
  vVar2 = basic_variable<std::allocator<char>_>::symbol(self);
  if (vVar2 - boolean < 7) {
    bVar1 = detail::overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>
            ::equal(self,other);
    sVar3 = (size_type)bVar1;
  }
  else if (vVar2 - array < 2) {
    basic_variable<std::allocator<char>_>::begin((const_iterator *)&local_48,self);
    sVar3 = 0;
    while( true ) {
      basic_variable<std::allocator<char>_>::end(&local_60,self);
      bVar1 = basic_variable<std::allocator<char>_>::const_iterator::operator!=
                        ((const_iterator *)&local_48,&local_60);
      detail::
      small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
      ::~small_union(&local_60.
                      super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                      .current);
      if (!bVar1) break;
      self_00 = basic_variable<std::allocator<char>_>::
                iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
                ::value(&local_48);
      bVar1 = detail::
              overloader<trial::dynamic::basic_variable<std::allocator<char>_>,_double,_void>::equal
                        (self_00,other);
      sVar3 = sVar3 + bVar1;
      basic_variable<std::allocator<char>_>::
      iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::const_iterator,_const_trial::dynamic::basic_variable<std::allocator<char>_>_>
      ::operator++(&local_48);
    }
    detail::
    small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_unsigned_char,_const_trial::dynamic::basic_variable<std::allocator<char>_>_*,___gnu_cxx::__normal_iterator<const_trial::dynamic::basic_variable<std::allocator<char>_>_*,_std::vector<trial::dynamic::basic_variable<std::allocator<char>_>,_std::allocator<trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>_>_>
    ::~small_union(&local_48.current);
  }
  else {
    sVar3 = (size_type)vVar2;
  }
  return sVar3;
}

Assistant:

auto count(const basic_variable<Allocator>& self,
           const T& other) -> typename basic_variable<Allocator>::size_type
{
    switch (self.symbol())
    {
    case symbol::null:
        return 0;

    case symbol::boolean:
    case symbol::integer:
    case symbol::real:
    case symbol::string:
    case symbol::wstring:
    case symbol::u16string:
    case symbol::u32string:
        return (self == other) ? 1 : 0;

    case symbol::array:
    case symbol::map:
        {
            typename basic_variable<Allocator>::size_type result = 0;
            for (auto it = self.begin(); it != self.end(); ++it)
            {
                if (*it == other)
                    ++result;
            }
            return result;
        }
    }
    TRIAL_DYNAMIC_UNREACHABLE();
}